

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge_scalarmult_base.c
# Opt level: O0

void crypto_sign_ed25519_ref10_ge_scalarmult_base(ge_p3 *h,uchar *a)

{
  long in_RSI;
  timeval *in_R8;
  int i;
  ge_precomp t;
  ge_p2 s;
  ge_p1p1 r;
  char carry;
  char e [64];
  ge_p1p1 *in_stack_fffffffffffffe08;
  int iVar1;
  undefined4 in_stack_fffffffffffffe14;
  ge_p2 *in_stack_fffffffffffffe28;
  ge_p1p1 *in_stack_fffffffffffffe30;
  ge_p3 *in_stack_fffffffffffffe38;
  ge_p1p1 *in_stack_fffffffffffffe40;
  ge_p3 *in_stack_fffffffffffffe78;
  ge_p1p1 *in_stack_fffffffffffffe80;
  char local_59;
  byte abStack_58 [88];
  
  for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 1) {
    abStack_58[iVar1 << 1] = *(byte *)(in_RSI + iVar1) & 0xf;
    abStack_58[iVar1 * 2 + 1] = (byte)((int)(uint)*(byte *)(in_RSI + iVar1) >> 4);
  }
  local_59 = '\0';
  for (iVar1 = 0; iVar1 < 0x3f; iVar1 = iVar1 + 1) {
    abStack_58[iVar1] = abStack_58[iVar1] + local_59;
    local_59 = (char)(abStack_58[iVar1] + 8) >> 4;
    abStack_58[iVar1] = abStack_58[iVar1] + local_59 * -0x10;
  }
  abStack_58[0x3f] = abStack_58[0x3f] + local_59;
  crypto_sign_ed25519_ref10_ge_p3_0((ge_p3 *)0x10dcab);
  for (iVar1 = 1; iVar1 < 0x40; iVar1 = iVar1 + 2) {
    select((int)&stack0xfffffffffffffe14,(fd_set *)((long)iVar1 / 2 & 0xffffffff),
           (fd_set *)(ulong)(uint)(int)(char)abStack_58[iVar1],(fd_set *)0x2,in_R8);
    crypto_sign_ed25519_ref10_ge_madd
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (ge_precomp *)in_stack_fffffffffffffe30);
    crypto_sign_ed25519_ref10_ge_p1p1_to_p3
              ((ge_p3 *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_stack_fffffffffffffe08);
  }
  crypto_sign_ed25519_ref10_ge_p3_dbl(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  crypto_sign_ed25519_ref10_ge_p1p1_to_p2
            ((ge_p2 *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_stack_fffffffffffffe08);
  crypto_sign_ed25519_ref10_ge_p2_dbl(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  crypto_sign_ed25519_ref10_ge_p1p1_to_p2
            ((ge_p2 *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_stack_fffffffffffffe08);
  crypto_sign_ed25519_ref10_ge_p2_dbl(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  crypto_sign_ed25519_ref10_ge_p1p1_to_p2
            ((ge_p2 *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_stack_fffffffffffffe08);
  crypto_sign_ed25519_ref10_ge_p2_dbl(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  crypto_sign_ed25519_ref10_ge_p1p1_to_p3
            ((ge_p3 *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_stack_fffffffffffffe08);
  for (iVar1 = 0; iVar1 < 0x40; iVar1 = iVar1 + 2) {
    select((int)&stack0xfffffffffffffe14,(fd_set *)((long)iVar1 / 2 & 0xffffffff),
           (fd_set *)(ulong)(uint)(int)(char)abStack_58[iVar1],(fd_set *)0x2,in_R8);
    crypto_sign_ed25519_ref10_ge_madd
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (ge_precomp *)in_stack_fffffffffffffe30);
    crypto_sign_ed25519_ref10_ge_p1p1_to_p3
              ((ge_p3 *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_stack_fffffffffffffe08);
  }
  return;
}

Assistant:

void ge_scalarmult_base(ge_p3 *h,const unsigned char *a)
{
  signed char e[64];
  signed char carry;
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  int i;

  for (i = 0;i < 32;++i) {
    e[2 * i + 0] = (a[i] >> 0) & 15;
    e[2 * i + 1] = (a[i] >> 4) & 15;
  }
  /* each e[i] is between 0 and 15 */
  /* e[63] is between 0 and 7 */

  carry = 0;
  for (i = 0;i < 63;++i) {
    e[i] += carry;
    carry = e[i] + 8;
    carry >>= 4;
    e[i] -= carry << 4;
  }
  e[63] += carry;
  /* each e[i] is between -8 and 8 */

  ge_p3_0(h);
  for (i = 1;i < 64;i += 2) {
    select(&t,i / 2,e[i]);
    ge_madd(&r,h,&t); ge_p1p1_to_p3(h,&r);
  }

  ge_p3_dbl(&r,h);  ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s); ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s); ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s); ge_p1p1_to_p3(h,&r);

  for (i = 0;i < 64;i += 2) {
    select(&t,i / 2,e[i]);
    ge_madd(&r,h,&t); ge_p1p1_to_p3(h,&r);
  }
}